

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRegion __thiscall
QGraphicsItem::boundingRegion(QGraphicsItem *this,QTransform *itemToDeviceTransform)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  QPointF *in_RDX;
  int iVar4;
  undefined8 *puVar5;
  QStyleOptionGraphicsItem *pQVar6;
  QRect *pQVar7;
  QRect *rect;
  long in_FS_OFFSET;
  byte bVar8;
  uint uVar9;
  qreal qVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  QRect QVar17;
  undefined1 auVar18 [16];
  QPainter p;
  QTransform unscale;
  QStyleOptionGraphicsItem option;
  QRect local_188;
  QRegion local_178;
  QRect local_170;
  undefined1 *local_158;
  undefined1 *puStack_150;
  undefined1 *local_148;
  double local_138;
  double dStack_130;
  undefined1 local_120 [8];
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined1 *local_108;
  QSize local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  QRect local_e8 [5];
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar10 = boundingRegionGranularity((QGraphicsItem *)itemToDeviceTransform);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)((long)itemToDeviceTransform->m_matrix[0][0] + 0x18))(local_e8,itemToDeviceTransform);
  QTransform::mapRect((QRectF *)local_98);
  dVar14 = (double)(local_98._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
           (double)local_98._0_8_;
  dVar15 = 2147483647.0;
  if (dVar14 <= 2147483647.0) {
    dVar15 = dVar14;
  }
  if (dVar15 <= -2147483648.0) {
    dVar15 = -2147483648.0;
  }
  local_f8._0_4_ = (int)dVar15;
  dVar16 = (double)(local_98._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
           (double)local_98._8_8_;
  dVar14 = 2147483647.0;
  if (dVar16 <= 2147483647.0) {
    dVar14 = dVar16;
  }
  if (dVar14 <= -2147483648.0) {
    dVar14 = -2147483648.0;
  }
  local_f8._4_4_ = (int)dVar14;
  local_88 = ((double)local_98._0_8_ - (double)(int)dVar15) * 0.5 + local_88;
  local_88 = (double)((ulong)local_88 & 0x8000000000000000 | 0x3fe0000000000000) + local_88;
  dVar15 = 2147483647.0;
  if (local_88 <= 2147483647.0) {
    dVar15 = local_88;
  }
  if (dVar15 <= -2147483648.0) {
    dVar15 = -2147483648.0;
  }
  local_80 = ((double)local_98._8_8_ - (double)(int)dVar14) * 0.5 + local_80;
  local_80 = (double)((ulong)local_80 & 0x8000000000000000 | 0x3fe0000000000000) + local_80;
  dVar14 = 2147483647.0;
  if (local_80 <= 2147483647.0) {
    dVar14 = local_80;
  }
  if (dVar14 <= -2147483648.0) {
    dVar14 = -2147483648.0;
  }
  iVar4 = (int)dVar14 + local_f8._4_4_;
  uStack_f0._0_4_ = local_f8._0_4_ + (int)dVar15 + -1;
  if ((int)dVar15 == 0) {
    uStack_f0._0_4_ = local_f8._0_4_;
  }
  uStack_f0._4_4_ = iVar4 + -1;
  if (iVar4 == local_f8._4_4_) {
    uStack_f0._4_4_ = iVar4;
  }
  if ((qVar10 != 0.0) || (NAN(qVar10))) {
    uVar9 = (uint)(qVar10 * (double)((uStack_f0._0_4_ - local_f8._0_4_) + 1));
    uVar11 = (uint)(qVar10 * (double)((uStack_f0._4_4_ - local_f8._4_4_) + 1));
    uVar12 = -(uint)(-1 < (int)uVar9);
    uVar13 = -(uint)(-1 < (int)uVar11);
    local_100.wd.m_i = (uVar12 ^ 0xffffffff | uVar9 & uVar12) + 2;
    local_100.ht.m_i = (uVar13 ^ 0xffffffff | uVar11 & uVar13) + 2;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_118,&local_100,Format_ARGB32_Premultiplied);
    QImage::fill((uint)(QImage *)&local_118);
    local_120 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)local_120,(QPaintDevice *)&local_118);
    QPainter::setRenderHints((QPointF *)local_120,1,1);
    local_98._0_8_ = 0.0;
    local_98._8_8_ = 0.0;
    auVar18 = QTransform::map(in_RDX);
    local_138 = auVar18._0_8_ - (double)local_f8._0_4_;
    dStack_130 = auVar18._8_8_ - (double)local_f8._4_4_;
    QPainter::scale(qVar10,qVar10);
    QPainter::translate((QPointF *)local_120);
    local_98._8_8_ = 1.0;
    local_98._0_8_ = 1.0;
    QPainter::translate((QPointF *)local_120);
    QPainter::setWorldTransform((QTransform *)local_120,SUB81(in_RDX,0));
    QTransform::inverted((bool *)local_98);
    local_158 = (undefined1 *)0x0;
    puStack_150 = (undefined1 *)0x0;
    local_e8[0] = (QRect)QTransform::map((QPointF *)local_98);
    QPainter::translate((QPointF *)local_120);
    puVar5 = &DAT_007006b8;
    pQVar6 = (QStyleOptionGraphicsItem *)local_98;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = *puVar5;
      (pQVar6->super_QStyleOption).version = (int)uVar1;
      (pQVar6->super_QStyleOption).type = (int)((ulong)uVar1 >> 0x20);
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      pQVar6 = (QStyleOptionGraphicsItem *)((long)pQVar6 + (ulong)bVar8 * -0x10 + 8);
    }
    QStyleOptionGraphicsItem::QStyleOptionGraphicsItem((QStyleOptionGraphicsItem *)local_98);
    (**(code **)((long)itemToDeviceTransform->m_matrix[0][0] + 0x50))
              (itemToDeviceTransform,(QPointF *)local_120,(QStyleOptionGraphicsItem *)local_98,0);
    QPainter::end();
    puVar5 = &DAT_00700eb8;
    pQVar7 = local_e8;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = *puVar5;
      pQVar7->x1 = (Representation)(int)uVar1;
      pQVar7->y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      pQVar7 = (QRect *)&pQVar7[-(ulong)bVar8].x2;
    }
    QTransform::fromScale(1.0 / qVar10,1.0 / qVar10);
    this->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    local_158 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::createMaskFromColor(&local_170,&local_118,0,0);
    QBitmap::fromImage((QBitmap *)&local_158,&local_170,0);
    QImage::~QImage((QImage *)&local_170);
    QRegion::QRegion(&local_178,(QBitmap *)&local_158);
    lVar3 = QRegion::begin();
    lVar2 = QRegion::end();
    if (lVar3 != lVar2) {
      do {
        auVar18 = QTransform::mapRect(local_e8);
        local_188.x1.m_i = local_f8._0_4_ + auVar18._0_4_ + -2;
        local_188.x2.m_i = local_f8._0_4_ + auVar18._8_4_;
        local_188.y1.m_i = auVar18._4_4_ + local_f8._4_4_ + -2;
        local_188.y2.m_i = auVar18._12_4_ + local_f8._4_4_;
        QVar17 = (QRect)QRect::operator&(&local_188,(QRect *)&local_f8);
        local_170 = QVar17;
        QRegion::operator+=((QRegion *)this,&local_170);
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != lVar2);
    }
    QRegion::~QRegion(&local_178);
    QBitmap::~QBitmap((QBitmap *)&local_158);
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
    QPainter::~QPainter((QPainter *)local_120);
    QImage::~QImage((QImage *)&local_118);
  }
  else {
    QRegion::QRegion((QRegion *)this,(QRect *)&local_f8,Rectangle);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QGraphicsItem::boundingRegion(const QTransform &itemToDeviceTransform) const
{
    // ### Ideally we would have a better way to generate this region,
    // preferably something in the lines of QPainterPath::toRegion(QTransform)
    // coupled with a way to generate a painter path from a set of painter
    // operations (e.g., QPicture::toPainterPath() or so). The current
    // approach generates a bitmap with the size of the item's bounding rect
    // in device coordinates, scaled by b.r.granularity, then paints the item
    // into the bitmap, converts the result to a QRegion and scales the region
    // back to device space with inverse granularity.
    qreal granularity = boundingRegionGranularity();
    QRect deviceRect = itemToDeviceTransform.mapRect(boundingRect()).toRect();
    _q_adjustRect(&deviceRect);
    if (granularity == 0.0)
        return QRegion(deviceRect);

    int pad = 1;
    QSize bitmapSize(qMax(1, int(deviceRect.width() * granularity) + pad * 2),
                     qMax(1, int(deviceRect.height() * granularity) + pad * 2));
    QImage mask(bitmapSize, QImage::Format_ARGB32_Premultiplied);
    mask.fill(0);
    QPainter p(&mask);
    p.setRenderHints(QPainter::Antialiasing);

    // Transform painter (### this code is from QGraphicsScene::drawItemHelper
    // and doesn't work properly with perspective transformations).
    QPointF viewOrigo = itemToDeviceTransform.map(QPointF(0,  0));
    QPointF offset = viewOrigo - deviceRect.topLeft();
    p.scale(granularity, granularity);
    p.translate(offset);
    p.translate(pad, pad);
    p.setWorldTransform(itemToDeviceTransform, true);
    p.translate(itemToDeviceTransform.inverted().map(QPointF(0, 0)));

    // Render
    QStyleOptionGraphicsItem option;
    const_cast<QGraphicsItem *>(this)->paint(&p, &option, nullptr);
    p.end();

    // Transform QRegion back to device space
    QTransform unscale = QTransform::fromScale(1 / granularity, 1 / granularity);
    QRegion r;
    QBitmap colorMask = QBitmap::fromImage(mask.createMaskFromColor(0));
    for (const QRect &rect : QRegion(colorMask)) {
        QRect xrect = unscale.mapRect(rect).translated(deviceRect.topLeft() - QPoint(pad, pad));
        r += xrect.adjusted(-1, -1, 1, 1) & deviceRect;
    }
    return r;
}